

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  SegmentId id;
  BuilderArena *pBVar3;
  SegmentBuilder *this_00;
  WirePointer *pWVar4;
  SegmentBuilder *pSVar5;
  SegmentBuilder *pSVar6;
  uint uVar7;
  undefined8 *puVar8;
  OrphanBuilder *pOVar9;
  word *pwVar10;
  uint uVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  ulong __n;
  WirePointer *dst;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  CapTableBuilder *capTable;
  ulong uVar17;
  WirePointer *pWVar18;
  ushort uVar19;
  word *result_2;
  WirePointer *pWVar20;
  WirePointer *src;
  bool bVar21;
  AllocateResult AVar22;
  AllocateResult AVar23;
  AllocateResult AVar24;
  ElementSize oldSize;
  SegmentBuilder *local_108;
  StructSize local_100;
  uint local_fc;
  WirePointer *local_f8;
  CapTableBuilder *local_f0;
  Iterator __end5;
  uint local_e0;
  WirePointer *local_d8;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  uVar11 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar11 != 0) {
    pSVar6 = this->segment;
    capTable = this->capTable;
    pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
    if ((uVar11 & 3) == 2) {
      local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,elementSize);
      this_00 = BuilderArena::getSegment(pBVar3,id);
      uVar11 = (uint)(this->tag).content;
      pwVar10 = (this_00->super_SegmentReader).ptr.ptr;
      uVar12 = (ulong)(uVar11 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar10->content + uVar12);
      pOVar9 = (OrphanBuilder *)((long)&pwVar10[1].content + uVar12);
      if ((uVar11 & 4) == 0) {
        pWVar4 = (WirePointer *)(&pOVar9->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar9 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pWVar4 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
      elementSize = local_f8._0_4_;
    }
    else {
      pWVar4 = (WirePointer *)this->location;
      pOVar9 = this;
      this_00 = pSVar6;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(pOVar9->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left == LIST) {
      local_fc = (uint)elementSize >> 0x10;
      uVar11 = *(uint *)((long)&(pOVar9->tag).content + 4);
      oldSize = (ElementSize)uVar11 & INLINE_COMPOSITE;
      if (oldSize == INLINE_COMPOSITE) {
        uVar11 = (pWVar4->offsetAndKind).value;
        _kjCondition.left = uVar11 & 3;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == 0;
        if (_kjCondition.left != 0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x5c7,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          goto LAB_0015dbfa;
        }
        local_d8 = pWVar4 + 1;
        uVar2 = *(ushort *)&pWVar4->field_1;
        uVar19 = *(ushort *)((long)&pWVar4->field_1 + 2);
        local_e0 = (uint)uVar19 + (uint)uVar2;
        uVar11 = uVar11 >> 2 & 0x1fffffff;
        ___end5 = (ulong)uVar11;
        local_100.pointers = 0;
        local_100.data = uVar2;
        if (uVar19 < elementSize.pointers || uVar2 < elementSize.data) {
          if (uVar2 <= elementSize.data) {
            local_100 = elementSize;
          }
          if (elementSize.pointers < uVar19) {
            local_fc = (uint)uVar19;
          }
          local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,local_100);
          local_100 = (StructSize)((uint)local_100 & 0xffff);
          uVar7 = local_fc + (int)local_100;
          uVar12 = ___end5 * uVar7;
          if (0x1ffffffe < uVar12) {
            local_f0 = capTable;
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
            capTable = local_f0;
          }
          if ((((this->tag).content & 3) == 2) &&
             (local_108 = pSVar6,
             pSVar5 = BuilderArena::getSegment
                                ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                                 (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar6 = local_108, pSVar5->readOnly == false)) {
            uVar11 = (uint)(this->tag).content;
            puVar8 = (undefined8 *)
                     ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar11 & 0xfffffff8));
            if ((uVar11 & 4) == 0) {
              *puVar8 = 0;
            }
            else {
              *puVar8 = 0;
              puVar8[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar14 = (int)uVar12;
          uVar11 = iVar14 + 1;
          pOVar9 = this;
          if (pBVar3 == (BuilderArena *)0x0) {
            pwVar10 = pSVar6->pos;
            if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                       ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >> 3 <
                 (long)(ulong)uVar11) || (pSVar6->pos = pwVar10 + uVar11, pwVar10 == (word *)0x0)) {
              pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
              local_f0 = capTable;
              if (0x1fffffff < iVar14 + 2U) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&_kjCondition);
              }
              AVar24 = BuilderArena::allocate(pBVar3,iVar14 + 2U);
              pOVar9 = (OrphanBuilder *)AVar24.words;
              pSVar6 = AVar24.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar24.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar6->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar9->tag).content = 1;
              AVar23.words = (word *)&pOVar9->segment;
              AVar23.segment = pSVar6;
              capTable = local_f0;
            }
            else {
              AVar23.words = pwVar10;
              AVar23.segment = pSVar6;
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar10 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar23 = BuilderArena::allocate(pBVar3,uVar11);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar10 = AVar23.words;
          local_108 = AVar23.segment;
          *(int *)((long)&(pOVar9->tag).content + 4) = iVar14 * 8 + 7;
          *(int *)&pwVar10->content = (int)___end5 * 4;
          *(short *)((long)&pwVar10->content + 4) = (short)local_f8;
          *(short *)((long)&pwVar10->content + 6) = (short)local_fc;
          pWVar20 = (WirePointer *)(pwVar10 + 1);
          if ((int)___end5 != 0) {
            pWVar18 = (WirePointer *)(pwVar10 + (ulong)((uint)local_f8._0_4_ & 0xffff) + 1);
            local_f8 = pWVar4 + (ulong)uVar2 + 1;
            iVar14 = 0;
            pWVar13 = pWVar20;
            local_f0 = capTable;
            do {
              if (uVar2 != 0) {
                memcpy(pWVar13,local_d8,(ulong)uVar2 * 8);
              }
              pSVar6 = local_108;
              dst = pWVar18;
              uVar12 = (ulong)uVar19;
              src = local_f8;
              if (uVar19 != 0) {
                do {
                  WireHelpers::transferPointer(pSVar6,dst,this_00,src);
                  dst = dst + 1;
                  src = src + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              pWVar13 = pWVar13 + uVar7;
              local_d8 = local_d8 + local_e0;
              iVar14 = iVar14 + 1;
              pWVar18 = (WirePointer *)((long)&(pWVar18->offsetAndKind).value + (ulong)(uVar7 * 8));
              local_f8 = (WirePointer *)
                         ((long)&(local_f8->offsetAndKind).value + (ulong)(local_e0 * 8));
              capTable = local_f0;
            } while (iVar14 != (int)___end5);
          }
          uVar12 = ___end5;
          uVar11 = local_fc;
          uVar17 = local_e0 * ___end5;
          if (0x1ffffffe < uVar17) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          iVar14 = (int)uVar17 + 1;
          local_d8 = pWVar20;
          local_e0 = uVar7;
          if (iVar14 != 0) {
            uVar7 = iVar14 * 8;
LAB_0015e4d7:
            memset(pWVar4,0,(ulong)uVar7);
          }
LAB_0015e4e2:
          uVar19 = (ushort)uVar11;
          uVar11 = (uint)uVar12;
          this_00 = local_108;
        }
      }
      else {
        bVar21 = oldSize == POINTER;
        uVar12 = (ulong)(uVar11 >> 3);
        ___end5 = uVar12;
        if ((uVar11 & 7) != 0) {
          uVar17 = (ulong)oldSize;
          uVar7 = *(uint *)(BITS_PER_ELEMENT_TABLE + uVar17 * 4);
          _kjCondition._0_8_ = &oldSize;
          _kjCondition.op.content.ptr = "";
          _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_2218d;
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          if (oldSize != BIT) {
            if (oldSize == POINTER) {
              local_fc = local_fc + (local_fc == 0);
            }
            else {
              elementSize = (StructSize)
                            (((uint)elementSize & 0xffff) +
                            (uint)(((uint)elementSize & 0xffff) == 0));
            }
            local_100 = (StructSize)((uint)elementSize & 0xffff);
            local_e0 = (local_fc & 0xffff) + (int)local_100;
            local_f0 = capTable;
            if (0x1ffffffe < local_e0 * uVar12) {
              local_108 = pSVar6;
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
              pSVar6 = local_108;
            }
            iVar14 = (int)(local_e0 * uVar12);
            if ((((this->tag).content & 3) == 2) &&
               (local_108 = pSVar6,
               pSVar5 = BuilderArena::getSegment
                                  ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                                   (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
               pSVar6 = local_108, pSVar5->readOnly == false)) {
              uVar16 = (uint)(this->tag).content;
              puVar8 = (undefined8 *)
                       ((long)&((pSVar5->super_SegmentReader).ptr.ptr)->content +
                       (ulong)(uVar16 & 0xfffffff8));
              if ((uVar16 & 4) == 0) {
                *puVar8 = 0;
              }
              else {
                *puVar8 = 0;
                puVar8[1] = 0;
              }
            }
            (this->tag).content = 0;
            uVar16 = iVar14 + 1;
            pOVar9 = this;
            if (pBVar3 == (BuilderArena *)0x0) {
              pwVar10 = pSVar6->pos;
              if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                         ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >> 3 <
                   (long)(ulong)uVar16) || (pSVar6->pos = pwVar10 + uVar16, pwVar10 == (word *)0x0))
              {
                local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,elementSize);
                pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
                if (0x1fffffff < iVar14 + 2U) {
                  WireHelpers::allocate::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&_kjCondition);
                }
                AVar24 = BuilderArena::allocate(pBVar3,iVar14 + 2U);
                pOVar9 = (OrphanBuilder *)AVar24.words;
                pSVar6 = AVar24.segment;
                *(uint *)&(this->tag).content =
                     (int)AVar24.words - *(int *)&(pSVar6->super_SegmentReader).ptr.ptr &
                     0xfffffff8U | 2;
                *(uint *)((long)&(this->tag).content + 4) = (pSVar6->super_SegmentReader).id.value;
                *(undefined4 *)&(pOVar9->tag).content = 1;
                AVar24.words = (word *)&pOVar9->segment;
                AVar24.segment = pSVar6;
                elementSize = local_f8._0_4_;
              }
              else {
                AVar24.words = pwVar10;
                AVar24.segment = pSVar6;
                *(uint *)&(this->tag).content =
                     ((uint)((ulong)((long)pwVar10 - (long)this) >> 1) & 0xfffffffc) - 3;
              }
            }
            else {
              AVar24 = BuilderArena::allocate(pBVar3,uVar16);
              *(undefined4 *)&(this->tag).content = 0xfffffffd;
            }
            pwVar10 = AVar24.words;
            local_108 = AVar24.segment;
            *(int *)((long)&(pOVar9->tag).content + 4) = iVar14 * 8 + 7;
            *(int *)&pwVar10->content = (int)___end5 * 4;
            *(StructDataWordCount *)((long)&pwVar10->content + 4) = elementSize.data;
            *(short *)((long)&pwVar10->content + 6) = (short)local_fc;
            local_d8 = (WirePointer *)(pwVar10 + 1);
            if (oldSize == POINTER) {
              if (7 < uVar11) {
                pWVar20 = local_d8 + ((uint)elementSize & 0xffff);
                uVar17 = ___end5 & 0xffffffff;
                pWVar13 = pWVar4;
                do {
                  WireHelpers::transferPointer(local_108,pWVar20,this_00,pWVar13);
                  pWVar13 = pWVar13 + 1;
                  pWVar20 = (WirePointer *)
                            ((long)&(pWVar20->offsetAndKind).value + (ulong)(local_e0 * 8));
                  uVar11 = (int)uVar17 - 1;
                  uVar17 = (ulong)uVar11;
                } while (uVar11 != 0);
              }
            }
            else if (7 < uVar11) {
              __n = (ulong)(uVar7 >> 3);
              uVar15 = ___end5 & 0xffffffff;
              pWVar20 = local_d8;
              pWVar13 = pWVar4;
              do {
                if (0xfffffffffffffffb < uVar17 - 6) {
                  memcpy(pWVar20,pWVar13,__n);
                }
                pWVar13 = (WirePointer *)((long)&(pWVar13->offsetAndKind).value + __n);
                pWVar20 = (WirePointer *)
                          ((long)&(pWVar20->offsetAndKind).value + (ulong)(local_e0 * 8));
                uVar11 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar11;
              } while (uVar11 != 0);
            }
            uVar12 = ((uint)bVar21 * 0x40 + uVar7) * uVar12;
            uVar17 = uVar12 + 0x3f;
            if (0x7ffffff80 < uVar12) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&_kjCondition);
            }
            uVar12 = ___end5;
            capTable = local_f0;
            uVar11 = local_fc;
            if ((int)(uVar17 >> 6) != 0) {
              uVar7 = (uint)(uVar17 >> 3) & 0xfffffff8;
              goto LAB_0015e4d7;
            }
            goto LAB_0015e4e2;
          }
          local_f0 = capTable;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[123]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x61b,FAILED,"oldSize != ElementSize::BIT",
                     "_kjCondition,\"Schema mismatch: Found bit list where struct list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                     ,(DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [123])
                     "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                    );
          kj::_::Debug::Fault::~Fault(&f);
          goto LAB_0015dc06;
        }
        local_f8 = (WirePointer *)CONCAT44(local_f8._4_4_,elementSize);
        local_100 = (StructSize)((uint)elementSize & 0xffff);
        local_e0 = local_fc + (int)local_100;
        uVar12 = local_e0 * uVar12;
        if (0x1ffffffe < uVar12) {
          WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&_kjCondition);
        }
        AVar22.words = &this->tag;
        AVar22.segment = pSVar6;
        if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
          WireHelpers::zeroObject(pSVar6,capTable,(WirePointer *)this);
        }
        pwVar10 = pSVar6->pos;
        uVar17 = uVar12 + 1 & 0xffffffff;
        if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                   ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >> 3 <
             (long)uVar17) || (pSVar6->pos = pwVar10 + uVar17, pwVar10 == (word *)0x0)) {
          uVar11 = (int)uVar12 + 2;
          pBVar3 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
          local_f0 = capTable;
          if (0x1fffffff < uVar11) {
            WireHelpers::allocate::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&_kjCondition);
          }
          AVar22 = BuilderArena::allocate(pBVar3,uVar11);
          *(uint *)&(this->tag).content =
               (int)AVar22.words - *(int *)&((AVar22.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          *(uint *)((long)&(this->tag).content + 4) =
               ((AVar22.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar22.words)->content = 1;
          pwVar10 = AVar22.words + 1;
        }
        else {
          *(uint *)&(this->tag).content =
               ((uint)((ulong)((long)pwVar10 - (long)this) >> 1) & 0xfffffffc) - 3;
          local_f0 = capTable;
        }
        this_00 = AVar22.segment;
        *(int *)((long)&(AVar22.words)->content + 4) = (int)uVar12 * 8 + 7;
        uVar11 = (uint)___end5;
        *(uint *)&pwVar10->content = uVar11 * 4;
        *(short *)((long)&pwVar10->content + 4) = (short)local_f8;
        uVar19 = (ushort)local_fc;
        *(ushort *)((long)&pwVar10->content + 6) = uVar19;
        local_d8 = (WirePointer *)(pwVar10 + 1);
        capTable = local_f0;
      }
      __return_storage_ptr__->segment = this_00;
      __return_storage_ptr__->capTable = capTable;
      __return_storage_ptr__->ptr = (byte *)local_d8;
      __return_storage_ptr__->elementCount = uVar11;
      __return_storage_ptr__->step = local_e0 << 6;
      __return_storage_ptr__->structDataSize = (int)local_100 << 6;
      __return_storage_ptr__->structPointerCount = uVar19;
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      goto LAB_0015dc26;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x5bb,FAILED,"oldRef->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Called getList{Field,Element}() but existing pointer is not a \" \"list.\""
               ,&_kjCondition,
               (char (*) [85])
               "Schema mismatch: Called getList{Field,Element}() but existing pointer is not a list."
              );
LAB_0015dbfa:
    kj::_::Debug::Fault::~Fault(&f);
  }
LAB_0015dc06:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  local_d8 = (WirePointer *)0x0;
LAB_0015dc26:
  pWVar4 = local_d8 + -1;
  if (local_d8 == (WirePointer *)0x0) {
    pWVar4 = (WirePointer *)0x0;
  }
  this->location = (word *)pWVar4;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}